

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayComponents(cmComputeLinkDepends *this)

{
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  pointer pcVar4;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  size_type sVar5;
  vector<int,_std::allocator<int>_> *this_01;
  undefined8 uVar6;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_02;
  reference this_03;
  uint *puVar7;
  int i_1;
  cmGraphEdge *oi;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  EdgeList *__range2_1;
  EdgeList *ol;
  const_iterator cStack_40;
  int i;
  const_iterator __end2;
  const_iterator __begin2;
  NodeList *__range2;
  NodeList *nl;
  uint c;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeLinkDepends *this_local;
  
  fprintf(_stderr,"The strongly connected components are:\n");
  pcVar4 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
           operator->(&this->CCG);
  this_00 = cmComputeComponentGraph::GetComponents(pcVar4);
  nl._4_4_ = 0;
  while( true ) {
    sVar5 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
    if (sVar5 <= nl._4_4_) break;
    fprintf(_stderr,"Component (%u):\n",(ulong)nl._4_4_);
    this_01 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                         (this_00,(ulong)nl._4_4_)->super_vector<int,_std::allocator<int>_>;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_01);
    cStack_40 = std::vector<int,_std::allocator<int>_>::end(this_01);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0);
      if (!bVar2) break;
      puVar7 = (uint *)__gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&__end2);
      pFVar1 = _stderr;
      uVar3 = *puVar7;
      std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
      ::operator[](&this->EntryList,(long)(int)uVar3);
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"  item %d [%s]\n",(ulong)uVar3,uVar6);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    pcVar4 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ::operator->(&this->CCG);
    this_02 = &cmComputeComponentGraph::GetComponentGraphEdges(pcVar4,nl._4_4_)->
               super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2_1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_02);
    oi = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_02);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                          *)&oi);
      pFVar1 = _stderr;
      if (!bVar2) break;
      this_03 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&__end2_1);
      uVar3 = cmGraphEdge::operator_cast_to_int(this_03);
      fprintf(_stderr,"  followed by Component (%d)\n",(ulong)uVar3);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2_1);
    }
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->ComponentOrder,(ulong)nl._4_4_);
    fprintf(pFVar1,"  topo order index %d\n",(ulong)*puVar7);
    nl._4_4_ = nl._4_4_ + 1;
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayComponents()
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  for (unsigned int c = 0; c < components.size(); ++c) {
    fprintf(stderr, "Component (%u):\n", c);
    NodeList const& nl = components[c];
    for (int i : nl) {
      fprintf(stderr, "  item %d [%s]\n", i, this->EntryList[i].Item.c_str());
    }
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(c);
    for (cmGraphEdge const& oi : ol) {
      int i = oi;
      fprintf(stderr, "  followed by Component (%d)\n", i);
    }
    fprintf(stderr, "  topo order index %d\n", this->ComponentOrder[c]);
  }
  fprintf(stderr, "\n");
}